

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Clock.cxx
# Opt level: O3

void __thiscall
Fl_Clock_Output::Fl_Clock_Output(Fl_Clock_Output *this,int X,int Y,int W,int H,char *L)

{
  Fl_Widget::Fl_Widget(&this->super_Fl_Widget,X,Y,W,H,L);
  (this->super_Fl_Widget)._vptr_Fl_Widget = (_func_int **)&PTR__Fl_Widget_00276f80;
  (this->super_Fl_Widget).box_ = '\x02';
  (this->super_Fl_Widget).color2_ = 0x25;
  (this->super_Fl_Widget).label_.align_ = 2;
  this->hour_ = 0;
  this->minute_ = 0;
  this->second_ = 0;
  this->value_ = 0;
  return;
}

Assistant:

Fl_Clock_Output::Fl_Clock_Output(int X, int Y, int W, int H, const char *L)
: Fl_Widget(X, Y, W, H, L) {
  box(FL_UP_BOX);
  selection_color(fl_gray_ramp(5));
  align(FL_ALIGN_BOTTOM);
  hour_ = 0;
  minute_ = 0;
  second_ = 0;
  value_ = 0;
}